

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O2

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_array(Print_value_visitor *this,Array *a)

{
  pointer ppVVar1;
  
  std::operator<<(this->out_,"[");
  for (ppVVar1 = (a->values).
                 super__Vector_base<iqxmlrpc::Value_*,_std::allocator<iqxmlrpc::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar1 !=
      (a->values).super__Vector_base<iqxmlrpc::Value_*,_std::allocator<iqxmlrpc::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    std::operator<<(this->out_," ");
    Value::apply_visitor(*ppVVar1,&this->super_Value_type_visitor);
    std::operator<<(this->out_,",");
  }
  std::operator<<(this->out_," ]");
  return;
}

Assistant:

void Print_value_visitor::do_visit_array(const Array& a)
{
  out_ << "[";

  typedef Array::const_iterator CI;
  for(CI i = a.begin(); i != a.end(); ++i )
  {
    out_ << " ";
    i->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " ]";
}